

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiSetAuxdata(Fts5Context *pCtx,void *pPtr,_func_void_void_ptr *xDelete)

{
  int local_3c;
  Fts5Auxdata *pFStack_38;
  int rc;
  Fts5Auxdata *pData;
  Fts5Cursor *pCsr;
  _func_void_void_ptr *xDelete_local;
  void *pPtr_local;
  Fts5Context *pCtx_local;
  
  for (pFStack_38 = *(Fts5Auxdata **)(pCtx + 0x98);
      (pFStack_38 != (Fts5Auxdata *)0x0 && (pFStack_38->pAux != *(Fts5Auxiliary **)(pCtx + 0x90)));
      pFStack_38 = pFStack_38->pNext) {
  }
  pData = (Fts5Auxdata *)pCtx;
  pCsr = (Fts5Cursor *)xDelete;
  xDelete_local = (_func_void_void_ptr *)pPtr;
  pPtr_local = pCtx;
  if (pFStack_38 == (Fts5Auxdata *)0x0) {
    local_3c = 0;
    pFStack_38 = (Fts5Auxdata *)sqlite3Fts5MallocZero(&local_3c,0x20);
    if (pFStack_38 == (Fts5Auxdata *)0x0) {
      if (pCsr != (Fts5Cursor *)0x0) {
        (*(code *)pCsr)(xDelete_local);
      }
      return local_3c;
    }
    pFStack_38->pAux = (Fts5Auxiliary *)pData[4].xDelete;
    pFStack_38->pNext = pData[4].pNext;
    pData[4].pNext = pFStack_38;
  }
  else if (pFStack_38->xDelete != (_func_void_void_ptr *)0x0) {
    (*pFStack_38->xDelete)(pFStack_38->pPtr);
  }
  pFStack_38->xDelete = (_func_void_void_ptr *)pCsr;
  pFStack_38->pPtr = xDelete_local;
  return 0;
}

Assistant:

static int fts5ApiSetAuxdata(
  Fts5Context *pCtx,              /* Fts5 context */
  void *pPtr,                     /* Pointer to save as auxdata */
  void(*xDelete)(void*)           /* Destructor for pPtr (or NULL) */
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;

  /* Search through the cursors list of Fts5Auxdata objects for one that
  ** corresponds to the currently executing auxiliary function.  */
  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    if( pData->xDelete ){
      pData->xDelete(pData->pPtr);
    }
  }else{
    int rc = SQLITE_OK;
    pData = (Fts5Auxdata*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5Auxdata));
    if( pData==0 ){
      if( xDelete ) xDelete(pPtr);
      return rc;
    }
    pData->pAux = pCsr->pAux;
    pData->pNext = pCsr->pAuxdata;
    pCsr->pAuxdata = pData;
  }

  pData->xDelete = xDelete;
  pData->pPtr = pPtr;
  return SQLITE_OK;
}